

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbiter.cpp
# Opt level: O0

unique_ptr<std::vector<char,_std::allocator<char>_>,_std::default_delete<std::vector<char,_std::allocator<char>_>_>_>
 __thiscall arbiter::Arbiter::tryGetBinary(Arbiter *this,string *path)

{
  element_type *path_00;
  string *in_RDX;
  string local_a0;
  string local_80;
  string local_50 [32];
  undefined1 local_30 [24];
  string *path_local;
  Arbiter *this_local;
  
  path_local = path;
  this_local = this;
  ::std::__cxx11::string::string(local_50,in_RDX);
  getDriver((Arbiter *)local_30,path);
  path_00 = ::std::__shared_ptr_access<arbiter::Driver,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<arbiter::Driver,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_30);
  ::std::__cxx11::string::string((string *)&local_a0,in_RDX);
  stripProtocol(&local_80,&local_a0);
  Driver::tryGetBinary((Driver *)this,(string *)path_00);
  ::std::__cxx11::string::~string((string *)&local_80);
  ::std::__cxx11::string::~string((string *)&local_a0);
  ::std::shared_ptr<arbiter::Driver>::~shared_ptr((shared_ptr<arbiter::Driver> *)local_30);
  ::std::__cxx11::string::~string(local_50);
  return (__uniq_ptr_data<std::vector<char,_std::allocator<char>_>,_std::default_delete<std::vector<char,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::vector<char,_std::allocator<char>_>,_std::default_delete<std::vector<char,_std::allocator<char>_>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<std::vector<char>> Arbiter::tryGetBinary(std::string path) const
{
    return getDriver(path)->tryGetBinary(stripProtocol(path));
}